

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

void __thiscall
flatbuffers::TSGRPCGenerator::TSGRPCGenerator
          (TSGRPCGenerator *this,Parser *parser,string *path,string *filename)

{
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ts",&local_ab);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,filename,&local_68,&local_88,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fb540;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  CodeWriter::CodeWriter(&this->code_,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

TSGRPCGenerator(const Parser &parser, const std::string &path,
                  const std::string &filename)
      : BaseGenerator(parser, path, filename, "", "" /*Unused*/, "ts") {}